

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporaryfile.cpp
# Opt level: O3

bool __thiscall QTemporaryFileEngine::renameOverwrite(QTemporaryFileEngine *this,QString *newName)

{
  bool bVar1;
  
  if (this->unnamedFile == true) {
    bVar1 = materializeUnnamedFile(this,newName,Overwrite);
    QFSFileEngine::close(&this->super_QFSFileEngine,(int)newName);
    return bVar1;
  }
  QFSFileEngine::close(&this->super_QFSFileEngine,(int)newName);
  bVar1 = QFSFileEngine::rename_helper(&this->super_QFSFileEngine,newName,RenameOverwrite);
  return bVar1;
}

Assistant:

bool QTemporaryFileEngine::renameOverwrite(const QString &newName)
{
    if (isUnnamedFile()) {
        bool ok = materializeUnnamedFile(newName, Overwrite);
        QFSFileEngine::close();
        return ok;
    }
#ifdef Q_OS_WIN
    if (flags & Win32NonShared) {
        QFileSystemEntry newEntry(newName, QFileSystemEntry::FromInternalPath());
        bool ok = d_func()->nativeRenameOverwrite(newEntry);
        QFSFileEngine::close();
        if (ok) {
            // Match what QFSFileEngine::renameOverwrite() does
            setFileEntry(std::move(newEntry));
        }
        return ok;
    }
#endif
    QFSFileEngine::close();
    return QFSFileEngine::renameOverwrite(newName);
}